

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void runTest<main::__80>(char *name,int param_2)

{
  long lVar1;
  bool bVar2;
  ostream *poVar3;
  undefined1 auStack_48 [40];
  
  std::operator<<((ostream *)&std::cout,"[");
  lVar1 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 2;
  *(uint *)(std::__cxx11::string::assign + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::__cxx11::string::assign + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x80;
  testNo = testNo + 1;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,testNo);
  std::operator<<(poVar3,"] ");
  lVar1 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x28;
  *(uint *)(std::__cxx11::string::assign + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::__cxx11::string::assign + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  poVar3 = std::operator<<((ostream *)&std::cout,name);
  std::operator<<(poVar3," ... ");
  std::ostream::flush();
  if (param_2 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"SKIPPED");
    std::endl<char,std::char_traits<char>>(poVar3);
    skipped = skipped + 1;
  }
  else {
    calcStringHash<13ul,66ul>
              ((char (*) [13])"test key 000",
               (char (*) [66])"sed do eiusmod tempor incididunt ut labore et dolore magna aliqua",
               auStack_48);
    bVar2 = equalsHex<65ul>(auStack_48,
                            (char (*) [65])
                            "c36d4ed4191e617309867ed66a443be4075014e2b061bcdaf9ce7b721d2b77a8");
    if (!bVar2) {
      __assert_fail("equalsHex(hash, \"c36d4ed4191e617309867ed66a443be4075014e2b061bcdaf9ce7b721d2b77a8\")"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kulupu[P]randomx/src/tests/tests.cpp"
                    ,0x3d2,"auto main()::(anonymous class)::operator()() const");
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"PASSED");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return;
}

Assistant:

void runTest(const char* name, bool condition, FUNC f) {
	std::cout << "[";
	std::cout.width(2);
	std::cout << std::right << ++testNo << "] ";
	std::cout.width(40);
	std::cout << std::left << name << " ... ";
	std::cout.flush();
	if (condition) {
		f();
		std::cout << "PASSED" << std::endl;
	}
	else {
		std::cout << "SKIPPED" << std::endl;
		skipped++;
	}
}